

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

phnhashelement_t * phninstall(char *name,phnhashelement_t **hashtable)

{
  uint uVar1;
  char *pcVar2;
  phnhashelement_t *ppStack_28;
  uint hashval;
  phnhashelement_t *np;
  phnhashelement_t **hashtable_local;
  char *name_local;
  
  ppStack_28 = phnlookup(name,hashtable);
  if (ppStack_28 == (phnhashelement_t *)0x0) {
    ppStack_28 = (phnhashelement_t *)calloc(1,0x18);
    if (ppStack_28 != (phnhashelement_t *)0x0) {
      pcVar2 = strdup(name);
      ppStack_28->phone = pcVar2;
      if (pcVar2 != (char *)0x0) {
        uVar1 = phnhash(name);
        ppStack_28->next = hashtable[uVar1];
        hashtable[uVar1] = ppStack_28;
        goto LAB_00102baf;
      }
    }
    name_local = (char *)0x0;
  }
  else {
LAB_00102baf:
    name_local = (char *)ppStack_28;
  }
  return (phnhashelement_t *)name_local;
}

Assistant:

phnhashelement_t *phninstall(char *name, phnhashelement_t **hashtable)
{
    phnhashelement_t  *np;
    unsigned hashval;

    if ((np = phnlookup(name, hashtable)) == NULL)
    {
        np = (phnhashelement_t *) calloc (1,sizeof(*np));
        if (np == NULL || (np->phone = strdup(name)) == NULL)
            return NULL;

        hashval = phnhash(name);
        np->next = hashtable[hashval];
        hashtable[hashval] = np;
    }
    return np;
}